

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,unsigned_long>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,unsigned_long *args_2)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pgVar3 = arrays_->groups_;
  lVar8 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar11[0] = -(pgVar1->m[0].n == '\0');
  auVar11[1] = -(pgVar1->m[1].n == '\0');
  auVar11[2] = -(pgVar1->m[2].n == '\0');
  auVar11[3] = -(pgVar1->m[3].n == '\0');
  auVar11[4] = -(pgVar1->m[4].n == '\0');
  auVar11[5] = -(pgVar1->m[5].n == '\0');
  auVar11[6] = -(pgVar1->m[6].n == '\0');
  auVar11[7] = -(pgVar1->m[7].n == '\0');
  auVar11[8] = -(pgVar1->m[8].n == '\0');
  auVar11[9] = -(pgVar1->m[9].n == '\0');
  auVar11[10] = -(pgVar1->m[10].n == '\0');
  auVar11[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar11[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar11[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar11[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar11[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar9 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe);
  if (uVar9 == 0) {
    uVar4 = arrays_->groups_size_mask;
    lVar10 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar10 & uVar4;
      lVar8 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar12[0] = -(pgVar1->m[0].n == '\0');
      auVar12[1] = -(pgVar1->m[1].n == '\0');
      auVar12[2] = -(pgVar1->m[2].n == '\0');
      auVar12[3] = -(pgVar1->m[3].n == '\0');
      auVar12[4] = -(pgVar1->m[4].n == '\0');
      auVar12[5] = -(pgVar1->m[5].n == '\0');
      auVar12[6] = -(pgVar1->m[6].n == '\0');
      auVar12[7] = -(pgVar1->m[7].n == '\0');
      auVar12[8] = -(pgVar1->m[8].n == '\0');
      auVar12[9] = -(pgVar1->m[9].n == '\0');
      auVar12[10] = -(pgVar1->m[10].n == '\0');
      auVar12[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar12[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar12[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar12[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar12[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar6 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe;
      uVar9 = (uint)uVar6;
      lVar10 = lVar10 + 1;
    } while (uVar6 == 0);
  }
  uVar5 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar5;
  pcVar7 = args_1->_M_str;
  (ppVar2->first)._M_len = args_1->_M_len;
  (ppVar2->first)._M_str = pcVar7;
  ppVar2->second = *args_2;
  (pgVar3->m + lVar8)[uVar5].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar8);
  __return_storage_ptr__->n = uVar5;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }